

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signmessage.cpp
# Opt level: O0

RPCHelpMan * signmessagewithprivkey(void)

{
  initializer_list<RPCArg> __l;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_fffffffffffff758;
  RPCArg *this;
  anon_class_1_0_00000001 *in_stack_fffffffffffff760;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff768;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff770;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff788;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff790;
  allocator<char> *in_stack_fffffffffffff798;
  iterator in_stack_fffffffffffff7a0;
  undefined1 *puVar2;
  RPCArgOptions *in_stack_fffffffffffff7a8;
  string *in_stack_fffffffffffff7b0;
  Fallback *in_stack_fffffffffffff7b8;
  undefined1 skip_type_check;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff7c0;
  string *in_stack_fffffffffffff7c8;
  RPCArg *in_stack_fffffffffffff7d0;
  RPCResults *in_stack_fffffffffffff7d8;
  RPCResult *in_stack_fffffffffffff7e0;
  undefined8 in_stack_fffffffffffff8a0;
  undefined8 in_stack_fffffffffffff8a8;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_fffffffffffff8b0;
  pointer description;
  pointer name;
  pointer this_00;
  allocator<char> local_722;
  allocator<char> local_721 [32];
  allocator<char> local_701 [7];
  allocator<char> local_6fa;
  allocator<char> local_6f9 [8];
  allocator<char> local_6f1 [31];
  allocator<char> local_6d2;
  allocator<char> local_6d1 [145];
  RPCMethodImpl *in_stack_fffffffffffff9c0;
  undefined1 local_258 [528];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7a8,(char *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7a8,(char *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7a8,(char *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  local_6f9[1] = (allocator<char>)0x0;
  local_6f9[2] = (allocator<char>)0x0;
  local_6f9[3] = (allocator<char>)0x0;
  local_6f9[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff768,(Optional *)in_stack_fffffffffffff760);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7a8,(char *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  std::__cxx11::string::string(in_stack_fffffffffffff770);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff758);
  RPCArg::RPCArg(in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8,
                 (Type)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8,
                 in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7a8,(char *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  local_701[1] = (allocator<char>)0x0;
  local_701[2] = (allocator<char>)0x0;
  local_701[3] = (allocator<char>)0x0;
  local_701[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff768,(Optional *)in_stack_fffffffffffff760);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7a8,(char *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  std::__cxx11::string::string(in_stack_fffffffffffff770);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff758);
  RPCArg::RPCArg(in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8,
                 (Type)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8,
                 in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
  skip_type_check = (undefined1)((ulong)in_stack_fffffffffffff7b8 >> 0x38);
  std::allocator<RPCArg>::allocator(in_stack_fffffffffffff758);
  __l._M_len = (size_type)in_stack_fffffffffffff7a8;
  __l._M_array = in_stack_fffffffffffff7a0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff798,__l,
             (allocator_type *)in_stack_fffffffffffff790);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7a8,(char *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7a8,(char *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  description = (pointer)0x0;
  name = (pointer)0x0;
  this_00 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff758);
  RPCResult::RPCResult
            (in_stack_fffffffffffff7e0,(Type)((ulong)in_stack_fffffffffffff7d8 >> 0x20),
             &in_stack_fffffffffffff7d0->m_names,in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0
             ,(bool)skip_type_check);
  RPCResults::RPCResults(in_stack_fffffffffffff7d8,(RPCResult *)in_stack_fffffffffffff7d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7a8,(char *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7a8,(char *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  HelpExampleCli(in_stack_fffffffffffff790,in_stack_fffffffffffff788);
  std::operator+((char *)in_stack_fffffffffffff770,in_stack_fffffffffffff768);
  std::operator+(in_stack_fffffffffffff770,(char *)in_stack_fffffffffffff768);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7a8,(char *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7a8,(char *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  HelpExampleCli(in_stack_fffffffffffff790,in_stack_fffffffffffff788);
  std::operator+(in_stack_fffffffffffff790,in_stack_fffffffffffff788);
  std::operator+(in_stack_fffffffffffff770,(char *)in_stack_fffffffffffff768);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7a8,(char *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7a8,(char *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  HelpExampleRpc(in_stack_fffffffffffff790,in_stack_fffffffffffff788);
  std::operator+(in_stack_fffffffffffff790,in_stack_fffffffffffff788);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffff758,(string *)0x13ff42f);
  this = (RPCArg *)&stack0xfffffffffffff890;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<signmessagewithprivkey()::__0,void>
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             in_stack_fffffffffffff768,in_stack_fffffffffffff760);
  RPCHelpMan::RPCHelpMan
            ((RPCHelpMan *)this_00,&name->m_names,&description->m_names,in_stack_fffffffffffff8b0,
             (RPCResults *)in_stack_fffffffffffff8a8,(RPCExamples *)in_stack_fffffffffffff8a0,
             in_stack_fffffffffffff9c0);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff8b2);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff8b3);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff8b4);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff8b5);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff8b6);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff8b7);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff768);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_722);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_721);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff768);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  puVar2 = local_258;
  puVar1 = local_48;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_701);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_6fa);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_6f9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_6f1);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_6d2);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_6d1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan signmessagewithprivkey()
{
    return RPCHelpMan{"signmessagewithprivkey",
        "\nSign a message with the private key of an address\n",
        {
            {"privkey", RPCArg::Type::STR, RPCArg::Optional::NO, "The private key to sign the message with."},
            {"message", RPCArg::Type::STR, RPCArg::Optional::NO, "The message to create a signature of."},
        },
        RPCResult{
            RPCResult::Type::STR, "signature", "The signature of the message encoded in base 64"
        },
        RPCExamples{
            "\nCreate the signature\n"
            + HelpExampleCli("signmessagewithprivkey", "\"privkey\" \"my message\"") +
            "\nVerify the signature\n"
            + HelpExampleCli("verifymessage", "\"1D1ZrZNe3JUo7ZycKEYQQiQAWd9y54F4XX\" \"signature\" \"my message\"") +
            "\nAs a JSON-RPC call\n"
            + HelpExampleRpc("signmessagewithprivkey", "\"privkey\", \"my message\"")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
        {
            std::string strPrivkey = request.params[0].get_str();
            std::string strMessage = request.params[1].get_str();

            CKey key = DecodeSecret(strPrivkey);
            if (!key.IsValid()) {
                throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Invalid private key");
            }

            std::string signature;

            if (!MessageSign(key, strMessage, signature)) {
                throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Sign failed");
            }

            return signature;
        },
    };
}